

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnRefIsNullExpr(TypeChecker *this)

{
  bool bVar1;
  Type local_3c;
  Type local_34;
  Enum local_2c;
  Type local_28;
  Type local_20;
  Type type;
  TypeChecker *this_local;
  Result result;
  
  type = (Type)this;
  this_local._4_4_ = PeekType(this,0,&local_20);
  bVar1 = Type::IsRef(&local_20);
  if (!bVar1) {
    Type::Type(&local_28,Reference,0xffffffff);
    local_20 = local_28;
  }
  local_34 = local_20;
  local_2c = (Enum)PopAndCheck1Type(this,local_20,"ref.is_null");
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_2c);
  Type::Type(&local_3c,I32);
  PushType(this,local_3c);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnRefIsNullExpr() {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsRef()) {
    type = Type(Type::Reference, kInvalidIndex);
  }
  result |= PopAndCheck1Type(type, "ref.is_null");
  PushType(Type::I32);
  return result;
}